

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::setCurrentHoveredFloat(QMainWindowLayout *this,QDockWidgetGroupWindow *w)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  QDockWidgetGroupWindow *this_00;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QMainWindowLayout *in_stack_ffffffffffffff30;
  Connection *this_01;
  ConnectionType type;
  Object *in_stack_ffffffffffffff38;
  offset_in_QMainWindowLayout_to_subr in_stack_ffffffffffffff60;
  QMainWindowLayout *in_stack_ffffffffffffff70;
  code *in_stack_ffffffffffffff78;
  Object *in_stack_ffffffffffffff80;
  offset_in_QDockWidgetGroupWindow_to_subr in_stack_ffffffffffffffa0;
  ConnectionType in_stack_ffffffffffffffc0;
  Connection local_30;
  code *local_28;
  undefined8 local_20;
  Connection local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = ::operator!=((QPointer<QDockWidgetGroupWindow> *)in_stack_ffffffffffffff30,
                       (QDockWidgetGroupWindow **)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar1) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5f97f7);
    if (bVar1) {
      this_00 = (QDockWidgetGroupWindow *)(in_RDI + 0x7f0);
      QPointer<QDockWidgetGroupWindow>::data((QPointer<QDockWidgetGroupWindow> *)0x5f9816);
      in_stack_ffffffffffffffa0 = 0;
      QObject::disconnect<void(QObject::*)(QObject*),void(QMainWindowLayout::*)()>
                ((Object *)in_stack_ffffffffffffff38,
                 (offset_in_QObject_to_subr)in_stack_ffffffffffffff70,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff60);
      QPointer<QDockWidgetGroupWindow>::data((QPointer<QDockWidgetGroupWindow> *)0x5f987c);
      in_stack_ffffffffffffff78 = updateGapIndicator;
      in_stack_ffffffffffffff80 = (Object *)0x0;
      QObject::disconnect<void(QDockWidgetGroupWindow::*)(),void(QMainWindowLayout::*)()>
                (in_stack_ffffffffffffff38,
                 (offset_in_QDockWidgetGroupWindow_to_subr)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff60);
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidgetGroupWindow> *)0x5f98d6);
      if (bVar1) {
        QPointer<QDockWidgetGroupWindow>::operator->((QPointer<QDockWidgetGroupWindow> *)0x5f98ed);
        QDockWidgetGroupWindow::restore(this_00);
      }
    }
    else if (local_10 != 0) {
      restore(in_stack_ffffffffffffff30,SUB41((uint)in_stack_ffffffffffffff2c >> 0x18,0));
    }
    QPointer<QDockWidgetGroupWindow>::operator=
              ((QPointer<QDockWidgetGroupWindow> *)in_stack_ffffffffffffff30,
               (QDockWidgetGroupWindow *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (local_10 != 0) {
      type = 0x5f9a50;
      local_28 = updateGapIndicator;
      local_20 = 0;
      in_stack_ffffffffffffff70 = (QMainWindowLayout *)0x0;
      this_01 = &local_18;
      QObject::connect<void(QObject::*)(QObject*),void(QMainWindowLayout::*)()>
                ((Object *)in_stack_ffffffffffffff80,in_stack_ffffffffffffffa0,
                 (ContextType *)in_stack_ffffffffffffff78,(offset_in_QMainWindowLayout_to_subr *)0x0
                 ,in_stack_ffffffffffffffc0);
      QMetaObject::Connection::~Connection(this_01);
      QObject::connect<void(QDockWidgetGroupWindow::*)(),void(QMainWindowLayout::*)()>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffffa0,
                 (ContextType *)in_stack_ffffffffffffff78,
                 (offset_in_QMainWindowLayout_to_subr *)in_stack_ffffffffffffff70,type);
      QMetaObject::Connection::~Connection(&local_30);
    }
    updateGapIndicator(in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::setCurrentHoveredFloat(QDockWidgetGroupWindow *w)
{
    if (currentHoveredFloat != w) {
        if (currentHoveredFloat) {
            disconnect(currentHoveredFloat.data(), &QObject::destroyed,
                       this, &QMainWindowLayout::updateGapIndicator);
            disconnect(currentHoveredFloat.data(), &QDockWidgetGroupWindow::resized,
                       this, &QMainWindowLayout::updateGapIndicator);
            if (currentHoveredFloat)
                currentHoveredFloat->restore();
        } else if (w) {
            restore(true);
        }

        currentHoveredFloat = w;

        if (w) {
            connect(w, &QObject::destroyed,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
            connect(w, &QDockWidgetGroupWindow::resized,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
        }

        updateGapIndicator();
    }
}